

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O0

void keccakf(void *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *in_RDI;
  int i;
  uint8_t y;
  uint8_t x;
  uint64_t t;
  uint64_t b [5];
  uint64_t *a;
  int local_48;
  ulong local_38 [5];
  ulong *local_10;
  
  local_10 = in_RDI;
  memset(local_38,0,0x28);
  for (local_48 = 0; local_48 < 0x18; local_48 = local_48 + 1) {
    uVar1 = local_10[0x14] ^ local_10[0xf] ^ local_10[10] ^ local_10[5] ^ *local_10;
    uVar2 = local_10[0x15] ^ local_10[0x10] ^ local_10[0xb] ^ local_10[6] ^ local_10[1];
    uVar3 = local_10[0x16] ^ local_10[0x11] ^ local_10[0xc] ^ local_10[7] ^ local_10[2];
    uVar4 = local_10[0x17] ^ local_10[0x12] ^ local_10[0xd] ^ local_10[8] ^ local_10[3];
    uVar5 = local_10[0x18] ^ local_10[0x13] ^ local_10[0xe] ^ local_10[9] ^ local_10[4];
    *local_10 = uVar5 ^ (uVar2 << 1 | uVar2 >> 0x3f) ^ *local_10;
    local_10[5] = uVar5 ^ (uVar2 << 1 | uVar2 >> 0x3f) ^ local_10[5];
    local_10[10] = uVar5 ^ (uVar2 << 1 | uVar2 >> 0x3f) ^ local_10[10];
    local_10[0xf] = uVar5 ^ (uVar2 << 1 | uVar2 >> 0x3f) ^ local_10[0xf];
    local_10[0x14] = uVar5 ^ (uVar2 << 1 | uVar2 >> 0x3f) ^ local_10[0x14];
    local_10[1] = uVar1 ^ (uVar3 << 1 | uVar3 >> 0x3f) ^ local_10[1];
    local_10[6] = uVar1 ^ (uVar3 << 1 | uVar3 >> 0x3f) ^ local_10[6];
    local_10[0xb] = uVar1 ^ (uVar3 << 1 | uVar3 >> 0x3f) ^ local_10[0xb];
    local_10[0x10] = uVar1 ^ (uVar3 << 1 | uVar3 >> 0x3f) ^ local_10[0x10];
    local_10[0x15] = uVar1 ^ (uVar3 << 1 | uVar3 >> 0x3f) ^ local_10[0x15];
    local_10[2] = uVar2 ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ local_10[2];
    local_10[7] = uVar2 ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ local_10[7];
    local_10[0xc] = uVar2 ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ local_10[0xc];
    local_10[0x11] = uVar2 ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ local_10[0x11];
    local_10[0x16] = uVar2 ^ (uVar4 << 1 | uVar4 >> 0x3f) ^ local_10[0x16];
    local_10[3] = uVar3 ^ (uVar5 << 1 | uVar5 >> 0x3f) ^ local_10[3];
    local_10[8] = uVar3 ^ (uVar5 << 1 | uVar5 >> 0x3f) ^ local_10[8];
    local_10[0xd] = uVar3 ^ (uVar5 << 1 | uVar5 >> 0x3f) ^ local_10[0xd];
    local_10[0x12] = uVar3 ^ (uVar5 << 1 | uVar5 >> 0x3f) ^ local_10[0x12];
    local_10[0x17] = uVar3 ^ (uVar5 << 1 | uVar5 >> 0x3f) ^ local_10[0x17];
    local_10[4] = uVar4 ^ (uVar1 << 1 | uVar1 >> 0x3f) ^ local_10[4];
    local_10[9] = uVar4 ^ (uVar1 << 1 | uVar1 >> 0x3f) ^ local_10[9];
    local_10[0xe] = uVar4 ^ (uVar1 << 1 | uVar1 >> 0x3f) ^ local_10[0xe];
    local_10[0x13] = uVar4 ^ (uVar1 << 1 | uVar1 >> 0x3f) ^ local_10[0x13];
    local_10[0x18] = uVar4 ^ (uVar1 << 1 | uVar1 >> 0x3f) ^ local_10[0x18];
    uVar1 = local_10[10];
    local_10[10] = local_10[1] << '\x01' | local_10[1] >> 0x3f;
    uVar2 = local_10[7];
    local_10[7] = uVar1 << '\x03' | uVar1 >> 0x3d;
    uVar1 = local_10[0xb];
    local_10[0xb] = uVar2 << '\x06' | uVar2 >> 0x3a;
    uVar2 = local_10[0x11];
    local_10[0x11] = uVar1 << '\n' | uVar1 >> 0x36;
    uVar1 = local_10[0x12];
    local_10[0x12] = uVar2 << '\x0f' | uVar2 >> 0x31;
    uVar2 = local_10[3];
    local_10[3] = uVar1 << '\x15' | uVar1 >> 0x2b;
    uVar1 = local_10[5];
    local_10[5] = uVar2 << '\x1c' | uVar2 >> 0x24;
    uVar2 = local_10[0x10];
    local_10[0x10] = uVar1 << '$' | uVar1 >> 0x1c;
    uVar1 = local_10[8];
    local_10[8] = uVar2 << '-' | uVar2 >> 0x13;
    uVar2 = local_10[0x15];
    local_10[0x15] = uVar1 << '7' | uVar1 >> 9;
    uVar1 = local_10[0x18];
    local_10[0x18] = uVar2 << '\x02' | uVar2 >> 0x3e;
    uVar2 = local_10[4];
    local_10[4] = uVar1 << '\x0e' | uVar1 >> 0x32;
    uVar1 = local_10[0xf];
    local_10[0xf] = uVar2 << '\x1b' | uVar2 >> 0x25;
    uVar2 = local_10[0x17];
    local_10[0x17] = uVar1 << ')' | uVar1 >> 0x17;
    uVar1 = local_10[0x13];
    local_10[0x13] = uVar2 << '8' | uVar2 >> 8;
    uVar2 = local_10[0xd];
    local_10[0xd] = uVar1 << '\b' | uVar1 >> 0x38;
    uVar1 = local_10[0xc];
    local_10[0xc] = uVar2 << '\x19' | uVar2 >> 0x27;
    uVar2 = local_10[2];
    local_10[2] = uVar1 << '+' | uVar1 >> 0x15;
    uVar1 = local_10[0x14];
    local_10[0x14] = uVar2 << '>' | uVar2 >> 2;
    uVar2 = local_10[0xe];
    local_10[0xe] = uVar1 << '\x12' | uVar1 >> 0x2e;
    uVar1 = local_10[0x16];
    local_10[0x16] = uVar2 << '\'' | uVar2 >> 0x19;
    uVar2 = local_10[9];
    local_10[9] = uVar1 << '=' | uVar1 >> 3;
    uVar1 = local_10[6];
    local_10[6] = uVar2 << '\x14' | uVar2 >> 0x2c;
    local_38[0] = local_10[1];
    local_10[1] = uVar1 << ',' | uVar1 >> 0x14;
    uVar1 = *local_10;
    uVar2 = local_10[1];
    uVar3 = local_10[2];
    uVar4 = local_10[3];
    uVar5 = local_10[4];
    *local_10 = uVar1 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    local_10[1] = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar4;
    local_10[2] = uVar3 ^ (uVar4 ^ 0xffffffffffffffff) & uVar5;
    local_10[3] = uVar4 ^ (uVar5 ^ 0xffffffffffffffff) & uVar1;
    local_10[4] = uVar5 ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
    uVar1 = local_10[5];
    uVar2 = local_10[6];
    uVar3 = local_10[7];
    uVar4 = local_10[8];
    uVar5 = local_10[9];
    local_10[5] = uVar1 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    local_10[6] = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar4;
    local_10[7] = uVar3 ^ (uVar4 ^ 0xffffffffffffffff) & uVar5;
    local_10[8] = uVar4 ^ (uVar5 ^ 0xffffffffffffffff) & uVar1;
    local_10[9] = uVar5 ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
    uVar1 = local_10[10];
    uVar2 = local_10[0xb];
    uVar3 = local_10[0xc];
    uVar4 = local_10[0xd];
    uVar5 = local_10[0xe];
    local_10[10] = uVar1 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    local_10[0xb] = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar4;
    local_10[0xc] = uVar3 ^ (uVar4 ^ 0xffffffffffffffff) & uVar5;
    local_10[0xd] = uVar4 ^ (uVar5 ^ 0xffffffffffffffff) & uVar1;
    local_10[0xe] = uVar5 ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
    uVar1 = local_10[0xf];
    uVar2 = local_10[0x10];
    uVar3 = local_10[0x11];
    uVar4 = local_10[0x12];
    uVar5 = local_10[0x13];
    local_10[0xf] = uVar1 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    local_10[0x10] = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar4;
    local_10[0x11] = uVar3 ^ (uVar4 ^ 0xffffffffffffffff) & uVar5;
    local_10[0x12] = uVar4 ^ (uVar5 ^ 0xffffffffffffffff) & uVar1;
    local_10[0x13] = uVar5 ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
    uVar1 = local_10[0x14];
    uVar2 = local_10[0x15];
    uVar3 = local_10[0x16];
    uVar4 = local_10[0x17];
    uVar5 = local_10[0x18];
    local_10[0x14] = uVar1 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    local_10[0x15] = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar4;
    local_10[0x16] = uVar3 ^ (uVar4 ^ 0xffffffffffffffff) & uVar5;
    local_10[0x17] = uVar4 ^ (uVar5 ^ 0xffffffffffffffff) & uVar1;
    local_10[0x18] = uVar5 ^ (uVar1 ^ 0xffffffffffffffff) & uVar2;
    *local_10 = RC[local_48] ^ *local_10;
  }
  return;
}

Assistant:

static inline void keccakf(void* state) {
  uint64_t* a = (uint64_t*)state;
  uint64_t b[5] = {0};
  uint64_t t = 0;
  uint8_t x, y;

  for (int i = 0; i < 24; i++) {
    // Theta
    FOR5(x, 1, b[x] = 0; FOR5(y, 5, b[x] ^= a[x + y];))
    FOR5(x, 1, FOR5(y, 5, a[y + x] ^= b[(x + 4) % 5] ^ rol(b[(x + 1) % 5], 1);))
    // Rho and pi
    t = a[1];
    x = 0;
    REPEAT24(b[0] = a[pi[x]]; a[pi[x]] = rol(t, rho[x]); t = b[0]; x++;)
    // Chi
    FOR5(y, 5,
         FOR5(x, 1, b[x] = a[y + x];) FOR5(
             x, 1, a[y + x] = b[x] ^ ((~b[(x + 1) % 5]) & b[(x + 2) % 5]);))
    // Iota
    a[0] ^= RC[i];
  }
}